

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall dg::pta::PointerAnalysis::~PointerAnalysis(PointerAnalysis *this)

{
  code *pcVar1;
  PointerAnalysis *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~PointerAnalysis() = default;